

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::FullPrinter::run(FullPrinter *this,Module *module)

{
  undefined1 local_1a8 [8];
  PrintSExpression print;
  
  PrintSExpression::PrintSExpression((PrintSExpression *)local_1a8,(this->super_Printer).o);
  print.maybeNewLine._0_1_ = 1;
  print.lastPrintedLocation.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
  symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged =
       (((this->super_Printer).super_Pass.runner)->options).debugInfo;
  print.moduleStackIR.super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
  super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
  super__Optional_payload_base<wasm::ModuleStackIR>._56_8_ = module;
  PrintSExpression::visitModule((PrintSExpression *)local_1a8,module);
  PrintSExpression::~PrintSExpression((PrintSExpression *)local_1a8);
  return;
}

Assistant:

void run(Module* module) override {
    PrintSExpression print(o);
    print.setFull(true);
    print.setDebugInfo(getPassOptions().debugInfo);
    print.currModule = module;
    print.visitModule(module);
  }